

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::sectionEnded(RunContext *this,SectionInfo *info,Counts *prevAssertions)

{
  size_t *psVar1;
  RunningSection *pRVar2;
  RunningTest *pRVar3;
  IStreamingReporter *pIVar4;
  char cVar5;
  bool _missingAssertions;
  int iVar6;
  Counts local_b8;
  SectionStats local_a8;
  
  cVar5 = std::uncaught_exception();
  if (cVar5 == '\0') {
    local_b8.passed = (this->m_totals).assertions.passed - prevAssertions->passed;
    local_b8.failed = (this->m_totals).assertions.failed - prevAssertions->failed;
    if (((local_b8.failed + local_b8.passed == 0) &&
        (iVar6 = (*(((this->m_config).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[9])()
        , (char)iVar6 != '\0')) &&
       ((pRVar2 = this->m_runningTest->m_currentSection, pRVar2 == (RunningSection *)0x0 ||
        (pRVar2->m_state != Branch)))) {
      psVar1 = &(this->m_totals).assertions.failed;
      *psVar1 = *psVar1 + 1;
      local_b8.failed = local_b8.failed + 1;
      _missingAssertions = true;
    }
    else {
      _missingAssertions = false;
    }
    pRVar3 = this->m_runningTest;
    pRVar2 = pRVar3->m_currentSection;
    if ((int)pRVar2->m_state < 2) {
      pRVar2->m_state = TestedLeaf;
      pRVar3->m_runStatus = RanAtLeastOneSection;
      pRVar3->m_changed = true;
    }
    else if (pRVar3->m_runStatus == EncounteredASection) {
      pRVar3->m_runStatus = RanAtLeastOneSection;
      pRVar3->m_lastSectionToRun = pRVar2;
    }
    pRVar3->m_currentSection = pRVar2->m_parent;
    pIVar4 = (this->m_reporter).m_p;
    SectionStats::SectionStats(&local_a8,info,&local_b8,_missingAssertions);
    (*(pIVar4->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar4,&local_a8);
    SectionStats::~SectionStats(&local_a8);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
              (&this->m_messages,
               (this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start);
    return;
  }
  UnfinishedSections::UnfinishedSections((UnfinishedSections *)&local_a8,info,prevAssertions);
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::emplace_back<Catch::RunContext::UnfinishedSections>
            (&this->m_unfinishedSections,(UnfinishedSections *)&local_a8);
  if ((size_type *)local_a8.sectionInfo.description.field_2._8_8_ !=
      &local_a8.sectionInfo.lineInfo.file._M_string_length) {
    operator_delete((void *)local_a8.sectionInfo.description.field_2._8_8_);
  }
  if ((size_type *)local_a8.sectionInfo.name.field_2._8_8_ !=
      &local_a8.sectionInfo.description._M_string_length) {
    operator_delete((void *)local_a8.sectionInfo.name.field_2._8_8_);
  }
  if (local_a8._vptr_SectionStats == (_func_int **)&local_a8.sectionInfo.name._M_string_length) {
    return;
  }
  operator_delete(local_a8._vptr_SectionStats);
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = false;
            if( assertions.total() == 0 &&
                    m_config->warnAboutMissingAssertions() &&
                    !m_runningTest->isBranchSection() ) {
                m_totals.assertions.failed++;
                assertions.failed++;
                missingAssertions = true;

            }
            m_runningTest->endSection( info.name, false );

            m_reporter->sectionEnded( SectionStats( info, assertions, missingAssertions ) );
            m_messages.clear();
        }